

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(char *phrase,string *delimiter)

{
  ulong in_RDX;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string token;
  size_t pos;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  value_type *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  value_type local_a0;
  string local_80 [32];
  long local_60;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  char *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x176b2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,local_10,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = 0;
  std::__cxx11::string::string(local_80);
  while( true ) {
    local_60 = std::__cxx11::string::find(local_40,in_RDX);
    if (local_60 == -1) break;
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_40);
    in_stack_ffffffffffffff30 = local_80;
    in_stack_ffffffffffffff28 = &local_a0;
    std::__cxx11::string::operator=(in_stack_ffffffffffffff30,(string *)in_stack_ffffffffffffff28);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_40,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_19 = 1;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_40);
  if ((local_19 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff30);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> split(char* phrase, std::string delimiter)
{
  std::vector<std::string> list;
  std::string s = std::string(phrase);
  size_t pos = 0;
  std::string token;
  while ((pos = s.find(delimiter)) != std::string::npos)
  {
    token = s.substr(0, pos);
    list.push_back(token);
    s.erase(0, pos + delimiter.length());
  }
  list.push_back(s);
  return list;
}